

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveAlignFill::Encode(CDirectiveAlignFill *this)

{
  size_t in_RCX;
  void *__n;
  void *__buf;
  uchar buffer [128];
  undefined1 auStack_98 [128];
  
  __buf = (void *)this->finalSize;
  __n = (void *)0x80;
  if ((long)__buf < 0x80) {
    __n = __buf;
  }
  memset(auStack_98,*(int *)&this->fillByte,(size_t)__n);
  while( true ) {
    if ((long)__buf < 0x81) break;
    FileManager::write(g_fileManager,(int)auStack_98,(void *)0x80,in_RCX);
    __buf = (void *)((long)__buf + -0x80);
  }
  FileManager::write(g_fileManager,(int)auStack_98,__buf,in_RCX);
  return;
}

Assistant:

void CDirectiveAlignFill::Encode() const
{
	unsigned char buffer[128];
	int64_t n = finalSize;

	memset(buffer,fillByte,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(buffer,128);
		n -= 128;
	}

	g_fileManager->write(buffer,n);
}